

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void init_nhcolors(void)

{
  undefined2 uVar1;
  char *__s;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  nh_bool nVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  FILE *__stream;
  char *pcVar10;
  FILE *map;
  long lVar11;
  short *psVar12;
  int colorValue;
  int pos;
  fnchar filename [256];
  char line [256];
  int local_240;
  int local_23c;
  FILE local_238;
  char local_138 [264];
  
  cVar5 = has_colors();
  if (cVar5 != '\0') {
    ui_flags.color = '\x01';
    start_color();
    use_default_colors();
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 2) {
      uVar1 = *(undefined2 *)((long)colorlist + lVar8);
      *(undefined2 *)((long)color_map.fgColors + lVar8) = uVar1;
      *(undefined2 *)((long)color_map.bgColors + lVar8) = uVar1;
    }
    local_238._flags._0_1_ = 0;
    map = (FILE *)0x0;
    nVar6 = get_gamedir(CONFIG_DIR,(char *)&local_238);
    if (nVar6 != '\0') {
      map = &local_238;
      sVar9 = strlen((char *)map);
      *(undefined8 *)((long)&local_238._flags + sVar9) = 0x70616d726f6c6f63;
      *(undefined8 *)(local_238._shortbuf + (sVar9 - 0x7d)) = 0x666e6f632e7061;
      __stream = fopen((char *)map,"r");
      if (__stream != (FILE *)0x0) {
LAB_00108b64:
        pcVar10 = fgets(local_138,0x100,__stream);
        if (pcVar10 != (char *)0x0) {
          iVar7 = __isoc99_sscanf(local_138," %n%*s %i",&local_23c,&local_240);
          if (iVar7 == 1) {
            lVar8 = (long)local_23c;
            cVar5 = local_138[lVar8];
            if (cVar5 != '#') {
              pcVar10 = local_138;
              if (cVar5 == 'b') {
                if ((local_138[lVar8 + 1] != 'g') || (local_138[lVar8 + 2] != '.'))
                goto LAB_00108c14;
                pcVar10 = local_138 + 3;
                bVar2 = 1;
                bVar4 = 0;
                bVar3 = 0;
              }
              else {
                if (((cVar5 == 'f') && (local_138[lVar8 + 1] == 'g')) &&
                   (local_138[lVar8 + 2] == '.')) {
                  pcVar10 = local_138 + 3;
                  bVar4 = 1;
                  bVar3 = 0;
                }
                else {
LAB_00108c14:
                  bVar3 = 1;
                  bVar4 = 0;
                }
                bVar2 = 0;
              }
              psVar12 = color_map.bgColors;
              for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 8) {
                __s = *(char **)((long)colorNames + lVar11);
                sVar9 = strlen(__s);
                iVar7 = strncmp(pcVar10 + lVar8,__s,sVar9);
                if (iVar7 == 0) {
                  if ((-1 < local_240) && (local_240 < _COLORS)) {
                    if ((bool)(bVar4 | bVar3)) {
                      ((ColorMap *)(psVar12 + -0x10))->fgColors[0] = (short)local_240;
                    }
                    if ((bool)(bVar3 | bVar2)) {
                      *psVar12 = (short)local_240;
                    }
                  }
                  break;
                }
                psVar12 = psVar12 + 1;
              }
            }
          }
          goto LAB_00108b64;
        }
        fclose(__stream);
        map = __stream;
      }
    }
    apply_colormap((ColorMap *)map);
  }
  return;
}

Assistant:

void init_nhcolors(void)
{
    if (!has_colors())
	return;

    ui_flags.color = TRUE;

    start_color();
    use_default_colors();

    read_colormap(&color_map);
    apply_colormap(&color_map);
}